

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::Rehash(SQTable *this,bool force)

{
  _HashNode *size;
  byte in_SIL;
  SQTable *in_RDI;
  SQInteger k;
  _HashNode *old;
  SQInteger i;
  SQInteger nelems;
  _HashNode *nold;
  SQInteger oldsize;
  _HashNode *in_stack_ffffffffffffffa8;
  _HashNode *p_Var1;
  long local_40;
  SQInteger in_stack_ffffffffffffffc8;
  SQTable *in_stack_ffffffffffffffd0;
  long lVar2;
  _HashNode *p_Var3;
  _HashNode *key;
  SQTable *this_00;
  
  this_00 = (SQTable *)in_RDI->_numofnodes;
  if ((long)this_00 < 4) {
    this_00 = (SQTable *)0x4;
  }
  key = in_RDI->_nodes;
  size = (_HashNode *)CountUsed(in_RDI);
  p_Var1 = size;
  p_Var3 = size;
  if ((long)size < (long)this_00 - (long)this_00 / 4) {
    if (((long)this_00 / 4 < (long)size) || ((long)this_00 < 5)) {
      if ((in_SIL & 1) == 0) {
        return;
      }
      AllocNodes(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      AllocNodes(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  else {
    AllocNodes(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    size = in_stack_ffffffffffffffa8;
  }
  in_RDI->_usednodes = 0;
  for (lVar2 = 0; lVar2 < (long)this_00; lVar2 = lVar2 + 1) {
    if (key[lVar2].key.super_SQObject._type != OT_NULL) {
      NewSlot(this_00,&key->val,&p_Var3->val);
    }
  }
  for (local_40 = 0; local_40 < (long)this_00; local_40 = local_40 + 1) {
    _HashNode::~_HashNode(p_Var1);
  }
  sq_vm_free(p_Var1,(SQUnsignedInteger)size);
  return;
}

Assistant:

void SQTable::Rehash(bool force)
{
    SQInteger oldsize=_numofnodes;
    //prevent problems with the integer division
    if(oldsize<4)oldsize=4;
    _HashNode *nold=_nodes;
    SQInteger nelems=CountUsed();
    if (nelems >= oldsize-oldsize/4)  /* using more than 3/4? */
        AllocNodes(oldsize*2);
    else if (nelems <= oldsize/4 &&  /* less than 1/4? */
        oldsize > MINPOWER2)
        AllocNodes(oldsize/2);
    else if(force)
        AllocNodes(oldsize);
    else
        return;
    _usednodes = 0;
    for (SQInteger i=0; i<oldsize; i++) {
        _HashNode *old = nold+i;
        if (type(old->key) != OT_NULL)
            NewSlot(old->key,old->val);
    }
    for(SQInteger k=0;k<oldsize;k++)
        nold[k].~_HashNode();
    SQ_FREE(nold,oldsize*sizeof(_HashNode));
}